

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tobinary.cpp
# Opt level: O1

void checkOptions(Options *opts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  string *__return_storage_ptr__;
  string local_60;
  string local_40;
  
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"author=b","");
  paVar2 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Author of the program","");
  smf::Options::define(opts,&local_60,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"version=b","");
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Version of the program","");
  smf::Options::define(opts,&local_60,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"example=b","");
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Example useage of the program","");
  smf::Options::define(opts,&local_60,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"h|help=b","");
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"List of options for the program","");
  smf::Options::define(opts,&local_60,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  smf::Options::process(opts,1,0);
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"author","");
  bVar3 = smf::Options::getBoolean(opts,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (bVar3) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Written by Craig Stuart Sapp, ");
    pcVar6 = "craig@ccrma.stanford.edu, February 2015";
  }
  else {
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"version","");
    bVar3 = smf::Options::getBoolean(opts,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (!bVar3) {
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"help","");
      bVar3 = smf::Options::getBoolean(opts,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      __return_storage_ptr__ = &local_60;
      if (bVar3) {
        smf::Options::getCommand_abi_cxx11_(__return_storage_ptr__,opts);
        usage(__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_60);
      }
      else {
        local_60._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"example","");
        bVar3 = smf::Options::getBoolean(opts,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        if (!bVar3) {
          iVar4 = smf::Options::getArgCount(opts);
          if (iVar4 < 3) {
            iVar4 = smf::Options::getArgCount(opts);
            if (iVar4 != 0) {
              return;
            }
            pcVar6 = "Error: Too few filenames given.";
          }
          else {
            pcVar6 = "Error: Too many filenames given.";
          }
          poVar5 = std::operator<<((ostream *)&std::cerr,pcVar6);
          std::endl<char,std::char_traits<char>>(poVar5);
          exit(1);
        }
        example();
      }
      goto LAB_00111f95;
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"tobinary, version 1.0 (18 Feb 2015)\n");
    poVar5 = std::operator<<(poVar5,"compiled: ");
    pcVar6 = "Apr 26 2025";
  }
  poVar5 = std::operator<<(poVar5,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar5);
LAB_00111f95:
  exit(0);
}

Assistant:

void checkOptions(Options& opts) {
	opts.define("author=b",   "Author of the program");
	opts.define("version=b",  "Version of the program");
	opts.define("example=b",  "Example useage of the program");
	opts.define("h|help=b",   "List of options for the program");
	opts.process();

	if (opts.getBoolean("author")) {
		cout << "Written by Craig Stuart Sapp, "
		     << "craig@ccrma.stanford.edu, February 2015" << endl;
		exit(0);
	} else if (opts.getBoolean("version")) {
		cout << "tobinary, version 1.0 (18 Feb 2015)\n"
		     << "compiled: " << __DATE__ << endl;
		exit(0);
	} else if (opts.getBoolean("help")) {
		usage(opts.getCommand());
		exit(0);
	} else if (opts.getBoolean("example")) {
		example();
		exit(0);
	}

	if (opts.getArgCount() > 2) {
		cerr << "Error: Too many filenames given." << endl;
		exit(1);
	}
	if (opts.getArgCount() == 0) {
		cerr << "Error: Too few filenames given." << endl;
		exit(1);
	}

}